

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int balance(BtCursor *pCur)

{
  int N;
  u8 *puVar1;
  void *__dest;
  int *piVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  u8 uVar6;
  ushort uVar7;
  u16 uVar8;
  u32 uVar9;
  uint uVar10;
  BtShared *pBVar11;
  u8 *puVar12;
  uint *puVar13;
  PgHdr *pPVar14;
  u8 uVar15;
  u8 uVar16;
  undefined1 uVar17;
  undefined8 uVar18;
  char cVar19;
  byte bVar20;
  u16 uVar21;
  ushort uVar22;
  ushort uVar23;
  int iVar24;
  uint uVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  BtCursor *pBVar29;
  void *pvVar30;
  MemPage **ppMVar31;
  undefined1 *puVar32;
  ulong uVar33;
  Pgno PVar34;
  u8 *puVar35;
  long lVar36;
  undefined8 uVar37;
  int iVar38;
  uint uVar39;
  uint uVar40;
  MemPage **ppMVar41;
  ulong uVar42;
  MemPage *pPage;
  ulong uVar43;
  MemPage *pMVar44;
  MemPage *pMVar45;
  MemPage *pMVar46;
  int iVar47;
  uint uVar48;
  ulong uVar49;
  long lVar50;
  long lVar51;
  ulong uVar52;
  uint uVar53;
  long lVar54;
  ulong uVar55;
  MemPage **ppMVar56;
  uint uVar57;
  MemPage *pMVar58;
  int iVar59;
  uint uVar60;
  Pgno PVar61;
  int iVar62;
  u8 *puVar63;
  ulong uVar64;
  long in_FS_OFFSET;
  bool bVar65;
  MemPage *pChild;
  u16 szCell;
  int local_290;
  uint local_270;
  char local_200;
  void *local_1f8;
  undefined1 local_1c8 [32];
  Pgno local_1a8;
  int local_1a4;
  char local_1a0 [8];
  u8 local_198 [16];
  undefined1 local_188 [80];
  undefined8 local_138;
  undefined1 *puStack_130;
  undefined8 local_128;
  undefined1 *local_118;
  undefined1 *puStack_110;
  undefined4 local_108;
  int iStack_fc;
  undefined8 local_f8;
  undefined1 *puStack_f0;
  undefined4 local_e8;
  int iStack_dc;
  MemPage *local_d8;
  undefined1 *puStack_d0;
  undefined4 local_c8;
  int iStack_bc;
  undefined8 local_b8;
  undefined1 *puStack_b0;
  undefined4 local_a8;
  undefined1 *local_98 [2];
  MemPage *local_88 [4];
  undefined1 *local_68;
  MemPage *local_58 [4];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_198[8] = 0xaa;
  local_198[9] = 0xaa;
  local_198[10] = 0xaa;
  local_198[0xb] = 0xaa;
  local_198[0xc] = 0xaa;
  local_198[0] = 0xaa;
  local_198[1] = 0xaa;
  local_198[2] = 0xaa;
  local_198[3] = 0xaa;
  local_198[4] = 0xaa;
  local_198[5] = 0xaa;
  local_198[6] = 0xaa;
  local_198[7] = 0xaa;
  local_1f8 = (void *)0x0;
  pPage = pCur->pPage;
LAB_00155ea2:
  if ((pPage->nFree < 0) && (iVar24 = btreeComputeFreeSpace(pPage), iVar24 != 0)) {
    iVar24 = 0;
  }
  else if (pPage->nOverflow == '\0') {
    iVar38 = pPage->nFree * 3;
    uVar9 = pCur->pBt->usableSize;
    iVar59 = uVar9 * 2;
    iVar24 = 0;
    if ((iVar38 != iVar59 && SBORROW4(iVar38,iVar59) == (int)(iVar38 + uVar9 * -2) < 0) &&
       (cVar19 = pCur->iPage, cVar19 != '\0')) {
LAB_00155f23:
      if ((int)pPage->pDbPage->nRef < 2) {
        pMVar45 = pCur->apPage[(long)cVar19 + -1];
        uVar22 = pCur->aiIdx[(long)cVar19 + -1];
        iVar24 = sqlite3PagerWrite(pMVar45->pDbPage);
        pvVar30 = local_1f8;
        if ((iVar24 == 0) &&
           ((-1 < pMVar45->nFree || (iVar24 = btreeComputeFreeSpace(pMVar45), iVar24 == 0)))) {
          if ((pPage->intKeyLeaf != '\0') &&
             ((((pPage->nOverflow == '\x01' && (pPage->aiOvfl[0] == pPage->nCell)) &&
               (pMVar45->pgno != 1)) && (pMVar45->nCell == uVar22)))) {
            if (pPage->aiOvfl[0] == 0) {
              iVar24 = 0xb;
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x13379);
            }
            else {
              pBVar11 = pPage->pBt;
              local_88[0] = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
              local_b8 = (undefined1 *)CONCAT44(local_b8._4_4_,0xaaaaaaaa);
              iVar24 = allocateBtreePage(pBVar11,local_88,(Pgno *)&local_b8,0,'\0');
              if (iVar24 == 0) {
                local_58[0] = (MemPage *)pPage->apOvfl[0];
                uVar21 = (*pPage->xCellSize)(pPage,(u8 *)local_58[0]);
                pMVar46 = local_88[0];
                local_d8 = (MemPage *)CONCAT62(local_d8._2_6_,uVar21);
                local_128 = &DAT_aaaaaaaaaaaaaaaa;
                local_138 = &DAT_aaaaaaaaaaaaaaaa;
                puStack_130 = &DAT_aaaaaaaaaaaaaaaa;
                local_188._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_188._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_188._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_188._56_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_188._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_188._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_188._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_188._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_188._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_188._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                zeroPage(local_88[0],0xd);
                local_188._0_4_ = 1;
                local_188._16_8_ = local_58;
                local_188._24_8_ = &local_d8;
                local_188._32_8_ = pPage->aDataEnd;
                local_138._0_4_ = 2;
                local_128._4_4_ = 0x7fffffff;
                local_188._8_8_ = pPage;
                iVar24 = rebuildPage((CellArray *)local_188,0,1,pMVar46);
                local_1c8._0_4_ = iVar24;
                if (iVar24 == 0) {
                  pMVar46->nFree =
                       (pBVar11->usableSize - ((uint)(ushort)local_d8 + (uint)pMVar46->cellOffset))
                       + -2;
                  if (pBVar11->autoVacuum != '\0') {
                    ptrmapPut(pBVar11,(Pgno)local_b8,'\x05',pMVar45->pgno,(int *)local_1c8);
                    if (pMVar46->minLocal < (ushort)local_d8) {
                      ptrmapPutOvflPtr(pMVar46,pMVar46,&local_58[0]->isInit,(int *)local_1c8);
                    }
                  }
                  uVar64 = (ulong)(CONCAT11(pPage->aCellIdx[(ulong)pPage->nCell * 2 + -2],
                                            pPage->aCellIdx[(ulong)pPage->nCell * 2 + -1]) &
                                  pPage->maskPage);
                  uVar55 = 0;
                  puVar12 = pPage->aData + uVar64;
                  pMVar44 = (MemPage *)(pPage->aData + uVar64 + 2);
                  do {
                    pMVar58 = pMVar44;
                    puVar35 = puVar12;
                    if (7 < uVar55) break;
                    uVar55 = uVar55 + 1;
                    puVar12 = puVar35 + 1;
                    pMVar44 = (MemPage *)&pMVar58->intKey;
                  } while ((char)*puVar35 < '\0');
                  lVar36 = 4;
                  do {
                    uVar6 = *(u8 *)((long)&pMVar58[-1].xParseCell + 7);
                    local_58[0] = pMVar58;
                    local_198[lVar36] = uVar6;
                    lVar36 = lVar36 + 1;
                    if (-1 < (char)uVar6) break;
                    bVar65 = pMVar58 < (MemPage *)(puVar35 + 10);
                    pMVar58 = (MemPage *)&pMVar58->intKey;
                  } while (bVar65);
                  iVar24 = local_1c8._0_4_;
                  if (local_1c8._0_4_ == 0) {
                    iVar24 = insertCell(pMVar45,(uint)pMVar45->nCell,local_198,(int)lVar36,(u8 *)0x0
                                        ,pPage->pgno);
                  }
                  *(Pgno *)(pMVar45->aData + (ulong)pMVar45->hdrOffset + 8) =
                       (Pgno)local_b8 >> 0x18 | ((Pgno)local_b8 & 0xff0000) >> 8 |
                       ((Pgno)local_b8 & 0xff00) << 8 | (Pgno)local_b8 << 0x18;
                }
                if (pMVar46 != (MemPage *)0x0) {
                  sqlite3PagerUnrefNotNull(pMVar46->pDbPage);
                }
              }
            }
            goto LAB_00156f02;
          }
          pvVar30 = pcache1Alloc(pCur->pBt->pageSize);
          local_1a4 = 0;
          local_58[2] = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
          local_58[0] = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
          local_58[1] = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
          local_68 = &DAT_aaaaaaaaaaaaaaaa;
          local_88[2] = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
          local_88[3] = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
          local_88[0] = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
          local_88[1] = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
          local_98[0] = &DAT_aaaaaaaaaaaaaaaa;
          local_98[1] = &DAT_aaaaaaaaaaaaaaaa;
          local_a8 = 0xaaaaaaaa;
          local_b8 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
          local_c8 = 0xaaaaaaaa;
          local_d8 = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
          puStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
          local_e8 = 0xaaaaaaaa;
          local_f8 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_f0 = &DAT_aaaaaaaaaaaaaaaa;
          local_108 = 0xaaaaaaaa;
          local_118 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_110 = &DAT_aaaaaaaaaaaaaaaa;
          local_1a0[0] = '\0';
          local_1a0[1] = '\0';
          local_1a0[2] = '\0';
          local_1a0[3] = '\0';
          local_1a0[4] = 0;
          local_188._0_8_ = (MemPage *)0x0;
          local_188._8_8_ = (MemPage *)0x0;
          local_188._16_8_ = (MemPage **)0x0;
          local_188._24_8_ = (MemPage **)0x0;
          local_188._32_8_ = (u8 *)0x0;
          local_188._40_8_ = (u8 *)0x0;
          local_188._48_8_ = (u8 *)0x0;
          local_188._56_8_ = (u8 *)0x0;
          local_188._64_8_ = (u8 *)0x0;
          local_188._72_8_ = (u8 *)0x0;
          local_138._0_4_ = 0;
          local_138._4_4_ = 0;
          puStack_130 = (undefined1 *)0x0;
          local_128._0_4_ = 0;
          local_128._4_4_ = 0x7fffffff;
          if (pvVar30 != (void *)0x0) {
            uVar53 = pCur->hints & 1;
            uVar57 = (uint)pMVar45->nCell + (uint)pMVar45->nOverflow;
            iVar38 = 0;
            uVar48 = (uint)uVar22;
            if (1 < uVar57) {
              if (uVar48 == 0) {
                iVar38 = 0;
              }
              else if (uVar57 == uVar48) {
                iVar38 = uVar48 + uVar53 + -2;
              }
              else {
                iVar38 = uVar48 - 1;
              }
              uVar57 = 2 - uVar53;
            }
            uVar64 = (ulong)uVar57;
            uVar39 = (iVar38 - (uint)pMVar45->nOverflow) + uVar57;
            puVar12 = pMVar45->aData;
            if (uVar39 == pMVar45->nCell) {
              uVar55 = (ulong)pMVar45->hdrOffset + 8;
            }
            else {
              uVar55 = (ulong)(CONCAT11(pMVar45->aCellIdx[(long)(int)uVar39 * 2],
                                        pMVar45->aCellIdx[(long)(int)uVar39 * 2 + 1]) &
                              pMVar45->maskPage);
            }
            pBVar11 = pMVar45->pBt;
            uVar25 = uVar57 + 1;
            uVar39 = *(uint *)(puVar12 + uVar55);
            PVar61 = uVar39 >> 0x18 | (uVar39 & 0xff0000) >> 8 | (uVar39 & 0xff00) << 8 |
                     uVar39 << 0x18;
            uVar43 = (ulong)(uVar57 * 8);
            local_290 = iVar38 + -1;
            iVar59 = 0;
            uVar52 = uVar64;
            do {
              iVar24 = getAndInitPage(pBVar11,PVar61,(MemPage **)((long)local_58 + uVar43),0);
              uVar49 = uVar52;
              local_1a4 = iVar24;
              if (iVar24 != 0) break;
              pMVar46 = local_58[uVar52];
              if ((pMVar46->nFree < 0) &&
                 (iVar24 = btreeComputeFreeSpace(pMVar46), local_1a4 = iVar24, iVar24 != 0))
              goto LAB_00156625;
              iVar24 = iVar59 + (uint)pMVar46->nCell;
              iVar59 = iVar24 + 4;
              uVar49 = uVar52 - 1;
              if (uVar52 == 0) {
                uVar60 = iVar24 + 7;
                uVar39 = uVar60 & 0x7ffffffc;
                local_1a8 = PVar61;
                ppMVar31 = (MemPage **)sqlite3Malloc((long)(int)(uVar39 * 10 + pBVar11->pageSize));
                local_188._16_8_ = ppMVar31;
                if (ppMVar31 == (MemPage **)0x0) {
                  iVar24 = 7;
                  uVar53 = 0;
                  goto LAB_00156e85;
                }
                ppMVar41 = ppMVar31 + uVar39;
                local_188._24_8_ = ppMVar41;
                local_188._8_8_ = local_58[0];
                bVar3 = local_58[0]->leaf;
                lVar36 = (ulong)bVar3 * 4;
                bVar4 = local_58[0]->intKeyLeaf;
                uVar52 = 0;
                iVar59 = 0;
                iVar24 = 0;
                goto LAB_001566e9;
              }
              if (pMVar45->nOverflow == 0) {
                iVar24 = (int)uVar52 + local_290;
LAB_0015650f:
                puVar63 = pMVar45->aData;
                lVar36 = (long)(int)(iVar24 - (uint)pMVar45->nOverflow);
                uVar22 = CONCAT11(pMVar45->aCellIdx[lVar36 * 2],pMVar45->aCellIdx[lVar36 * 2 + 1]) &
                         pMVar45->maskPage;
                puVar35 = puVar63 + uVar22;
                local_98[uVar49] = puVar35;
                uVar39 = *(uint *)(puVar63 + uVar22);
                uVar21 = (*pMVar45->xCellSize)(pMVar45,puVar35);
                *(uint *)((long)&local_f8 + uVar49 * 4) = (uint)uVar21;
                if (((pBVar11->btsFlags & 0xc) != 0) &&
                   (iVar26 = (int)puVar35 - *(int *)&pMVar45->aData,
                   (int)(iVar26 + (uint)uVar21) <= (int)pBVar11->usableSize)) {
                  memcpy((void *)((long)iVar26 + (long)pvVar30),puVar35,(ulong)(uint)uVar21);
                  local_98[uVar49] =
                       (undefined1 *)(((long)puVar35 - (long)pMVar45->aData) + (long)pvVar30);
                }
                PVar61 = uVar39 >> 0x18 | (uVar39 & 0xff0000) >> 8 | (uVar39 & 0xff00) << 8 |
                         uVar39 << 0x18;
                dropCell(pMVar45,iVar24 - (uint)pMVar45->nOverflow,(uint)uVar21,&local_1a4);
                iVar24 = local_1a4;
              }
              else {
                if ((int)uVar52 + local_290 != (uint)pMVar45->aiOvfl[0]) {
                  iVar24 = iVar38 + (int)uVar49;
                  goto LAB_0015650f;
                }
                puVar13 = (uint *)pMVar45->apOvfl[0];
                local_98[uVar49] = (undefined1 *)puVar13;
                uVar39 = *puVar13;
                PVar61 = uVar39 >> 0x18 | (uVar39 & 0xff0000) >> 8 | (uVar39 & 0xff00) << 8 |
                         uVar39 << 0x18;
                uVar21 = (*pMVar45->xCellSize)(pMVar45,(u8 *)puVar13);
                *(uint *)((long)&local_f8 + uVar49 * 4) = (uint)uVar21;
                pMVar45->nOverflow = '\0';
                iVar24 = 0;
              }
              uVar43 = uVar43 - 8;
              uVar52 = uVar49;
            } while (iVar24 == 0);
            uVar43 = (long)((uVar49 << 0x20) + 0x100000000) >> 0x1d;
LAB_00156625:
            uVar53 = 0;
            __memset_chk(local_58,0,uVar43,0x18);
            goto LAB_00156e73;
          }
          iVar24 = 7;
          goto LAB_00156ee0;
        }
        goto LAB_00156f02;
      }
      uVar37 = 0x137f9;
LAB_00157a66:
      iVar24 = 0xb;
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar37,
                  "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
    }
  }
  else {
    cVar19 = pCur->iPage;
    if (cVar19 != '\0') goto LAB_00155f23;
    for (pBVar29 = pCur->pBt->pCursor; pBVar29 != (BtCursor *)0x0; pBVar29 = pBVar29->pNext) {
      if (((pBVar29 != pCur) && (pBVar29->eState == '\0')) && (pBVar29->pPage == pCur->pPage)) {
        uVar37 = 0x137bd;
        goto LAB_00157a66;
      }
    }
    local_188._0_8_ = (MemPage *)0x0;
    local_58[0] = (MemPage *)((ulong)local_58[0] & 0xffffffff00000000);
    pBVar11 = pPage->pBt;
    iVar24 = sqlite3PagerWrite(pPage->pDbPage);
    if (iVar24 == 0) {
      iVar24 = allocateBtreePage(pBVar11,(MemPage **)local_188,(Pgno *)local_58,pPage->pgno,'\0');
      pMVar45 = (MemPage *)local_188._0_8_;
      local_88[0] = (MemPage *)CONCAT44(local_88[0]._4_4_,iVar24);
      copyNodeContent(pPage,(MemPage *)local_188._0_8_,(int *)local_88);
      if (pBVar11->autoVacuum != '\0') {
        ptrmapPut(pBVar11,(Pgno)local_58[0],'\x05',pPage->pgno,(int *)local_88);
      }
      iVar24 = (int)local_88[0];
      if ((int)local_88[0] == 0) {
        memcpy((u16 *)((long)pMVar45 + 0x1c),pPage->aiOvfl,(ulong)((uint)pPage->nOverflow * 2));
        memcpy((u8 **)((long)pMVar45 + 0x28),pPage->apOvfl,(ulong)pPage->nOverflow << 3);
        *(u8 *)((long)pMVar45 + 0xc) = pPage->nOverflow;
        zeroPage(pPage,**(u8 **)((long)pMVar45 + 0x50) & 0xfffffff7);
        *(Pgno *)(pPage->aData + (ulong)pPage->hdrOffset + 8) =
             (Pgno)local_58[0] >> 0x18 | ((Pgno)local_58[0] & 0xff0000) >> 8 |
             ((Pgno)local_58[0] & 0xff00) << 8 | (Pgno)local_58[0] << 0x18;
        pCur->apPage[1] = pMVar45;
        pCur->iPage = '\x01';
        pCur->ix = 0;
        pCur->aiIdx[0] = 0;
        pCur->apPage[0] = pPage;
        iVar24 = 0;
        goto LAB_00156f25;
      }
      pCur->apPage[1] = (MemPage *)0x0;
      if (pMVar45 != (MemPage *)0x0) {
        sqlite3PagerUnrefNotNull(*(DbPage **)((long)pMVar45 + 0x70));
      }
    }
    else {
      pCur->apPage[1] = (MemPage *)0x0;
    }
  }
  goto LAB_00157a6d;
  while( true ) {
    uVar22 = pMVar46->cellOffset;
    uVar7 = pMVar46->nCell;
    if (puVar63 < puVar35 + (ulong)uVar7 * 2 + (ulong)uVar22) {
      lVar50 = (long)iVar24;
      lVar51 = 0;
      do {
        puVar1 = puVar63 + lVar51;
        *(u8 **)((long)ppMVar31 + lVar51 * 4 + lVar50 * 8) =
             puVar35 + (CONCAT11(*puVar1,puVar1[1]) & uVar23);
        iVar24 = iVar24 + 1;
        local_188._0_4_ = iVar24;
        lVar51 = lVar51 + 2;
      } while (puVar1 + 2 < puVar35 + (ulong)uVar7 * 2 + (ulong)uVar22);
    }
    *(int *)((long)&local_d8 + uVar52 * 4) = iVar24;
    if ((uVar52 < uVar64) && (bVar4 == 0)) {
      uVar10 = *(uint *)((long)&local_f8 + uVar52 * 4);
      uVar40 = uVar10 & 0xffff;
      lVar50 = (long)iVar24;
      *(short *)((long)ppMVar41 + lVar50 * 2) = (short)uVar10;
      __dest = (void *)((long)ppMVar41 + (long)iVar59 + (ulong)uVar39 * 2);
      iVar59 = iVar59 + uVar40;
      memcpy(__dest,local_98[uVar52],(ulong)uVar40);
      pMVar44 = (MemPage *)((long)__dest + lVar36);
      ppMVar31[lVar50] = pMVar44;
      uVar22 = *(short *)((long)ppMVar41 + lVar50 * 2) - (ushort)lVar36;
      *(ushort *)((long)ppMVar41 + lVar50 * 2) = uVar22;
      if (pMVar46->leaf == '\0') {
        puVar35 = pMVar46->aData;
        uVar6 = puVar35[9];
        uVar15 = puVar35[10];
        uVar16 = puVar35[0xb];
        pMVar44->isInit = puVar35[8];
        pMVar44->intKey = uVar6;
        pMVar44->intKeyLeaf = uVar15;
        pMVar44->field_0x3 = uVar16;
      }
      else if (uVar22 < 4) {
        puVar32 = (undefined1 *)
                  ((long)ppMVar31 + (long)iVar59 + (ulong)(uVar60 >> 2 & 0x1fffffff) * 0x28);
        do {
          *puVar32 = 0;
          uVar22 = *(short *)((long)ppMVar41 + lVar50 * 2) + 1;
          *(ushort *)((long)ppMVar41 + lVar50 * 2) = uVar22;
          puVar32 = puVar32 + 1;
          iVar59 = iVar59 + 1;
        } while (uVar22 < 4);
      }
      iVar24 = iVar24 + 1;
      local_188._0_4_ = iVar24;
    }
    uVar52 = uVar52 + 1;
    if (uVar52 == uVar25) break;
LAB_001566e9:
    pMVar46 = local_58[uVar52];
    puVar35 = pMVar46->aData;
    if (*puVar35 != *local_58[0]->aData) {
      uVar53 = 0;
      uVar37 = 0x13521;
      goto LAB_00156e65;
    }
    uVar22 = pMVar46->nCell;
    uVar23 = pMVar46->maskPage;
    puVar63 = puVar35 + pMVar46->cellOffset;
    lVar50 = (long)iVar24;
    memset((void *)((long)ppMVar41 + lVar50 * 2),0,
           (ulong)(((uint)uVar22 + (uint)pMVar46->nOverflow) * 2));
    bVar5 = pMVar46->nOverflow;
    if ((ulong)bVar5 != 0) {
      uVar7 = pMVar46->aiOvfl[0];
      if (uVar22 < uVar7) {
        uVar53 = 0;
        uVar37 = 0x13539;
        goto LAB_00156e65;
      }
      if (uVar7 != 0) {
        lVar51 = lVar50 << 0x20;
        lVar54 = 0;
        do {
          *(u8 **)((long)ppMVar31 + lVar54 * 4 + lVar50 * 8) =
               puVar35 + (uVar23 & CONCAT11(puVar63[lVar54],puVar63[lVar54 + 1]));
          lVar51 = lVar51 + 0x100000000;
          lVar54 = lVar54 + 2;
        } while ((uint)uVar7 * 2 != (int)lVar54);
        lVar50 = lVar51 >> 0x20;
        puVar63 = puVar63 + lVar54;
      }
      uVar43 = 0;
      do {
        ppMVar31[lVar50 + uVar43] = (MemPage *)pMVar46->apOvfl[uVar43];
        uVar43 = uVar43 + 1;
      } while (bVar5 != uVar43);
      iVar24 = (int)lVar50 + (int)uVar43;
      local_188._0_4_ = iVar24;
    }
  }
  iVar59 = pBVar11->usableSize + (uint)(ushort)lVar36 + -0xc;
  uVar52 = 0;
  iVar24 = 0;
  do {
    pMVar46 = local_58[uVar52];
    lVar50 = (long)iVar24;
    *(u8 **)(local_188 + lVar50 * 8 + 0x20) = pMVar46->aDataEnd;
    iVar26 = *(int *)((long)&local_d8 + uVar52 * 4);
    *(int *)((long)&local_138 + lVar50 * 4) = iVar26;
    iVar47 = 0;
    if ((iVar24 != 0) && (iVar47 = iVar24 + -1, iVar26 != *(int *)(local_188 + lVar50 * 4 + 0x4c)))
    {
      iVar47 = iVar24;
    }
    if (bVar4 == 0) {
      lVar50 = (long)iVar47;
      iVar47 = iVar47 + 1;
      *(u8 **)(local_188 + lVar50 * 8 + 0x28) = pMVar45->aDataEnd;
      *(int *)((long)&local_138 + lVar50 * 4 + 4) = iVar26 + 1;
    }
    iVar24 = iVar59 - pMVar46->nFree;
    *(int *)((long)&local_f8 + uVar52 * 4) = iVar24;
    if (pMVar46->nOverflow != '\0') {
      uVar43 = 0;
      do {
        uVar21 = (*pMVar46->xCellSize)(pMVar46,pMVar46->apOvfl[uVar43]);
        iVar24 = iVar24 + (uint)uVar21 + 2;
        *(int *)((long)&local_f8 + uVar52 * 4) = iVar24;
        uVar43 = uVar43 + 1;
      } while (uVar43 < pMVar46->nOverflow);
    }
    uVar37 = local_188._24_8_;
    *(int *)((long)&local_b8 + uVar52 * 4) = iVar26;
    uVar52 = uVar52 + 1;
    iVar24 = iVar47 + 1;
  } while (uVar52 != uVar25);
  iVar26 = local_188._0_4_;
  lVar50 = (long)(int)local_188._0_4_;
  uVar43 = 0;
  uVar52 = (ulong)uVar25;
  do {
    iVar24 = *(int *)((long)&local_f8 + uVar43 * 4);
    if (iVar59 < iVar24) {
      do {
        if ((long)(int)uVar52 <= (long)(uVar43 + 1)) {
          if (3 < uVar43) {
            *(int *)((long)&local_f8 + uVar43 * 4) = iVar24;
            uVar53 = 0;
            uVar37 = 0x1359e;
            goto LAB_00156e65;
          }
          *(undefined4 *)((long)&local_f8 + uVar43 * 4 + 4) = 0;
          *(int *)((long)&local_b8 + uVar43 * 4 + 4) = iVar26;
          uVar52 = (ulong)((int)uVar43 + 2);
        }
        iVar47 = *(int *)((long)&local_b8 + uVar43 * 4);
        lVar51 = (long)iVar47;
        uVar49 = lVar51 - 1;
        uVar22 = *(ushort *)(uVar37 + lVar51 * 2 + -2);
        if (uVar22 == 0) {
          uVar22 = computeCellSize((CellArray *)local_188,(int)uVar49);
        }
        iVar27 = uVar22 + 2;
        if ((bVar4 == 0) && (iVar27 = 0, iVar47 < iVar26)) {
          uVar23 = *(ushort *)(uVar37 + lVar51 * 2);
          if (uVar23 == 0) {
            uVar23 = computeCellSize((CellArray *)local_188,iVar47);
          }
          iVar27 = uVar23 + 2;
        }
        piVar2 = (int *)((long)&local_f8 + uVar43 * 4 + 4);
        *piVar2 = *piVar2 + iVar27;
        iVar24 = iVar24 - (uVar22 + 2);
        *(int *)((long)&local_b8 + uVar43 * 4) = (int)uVar49;
      } while (iVar59 < iVar24);
    }
    else {
      uVar49 = (ulong)*(uint *)((long)&local_b8 + uVar43 * 4);
    }
    *(int *)((long)&local_f8 + uVar43 * 4) = iVar24;
    iVar47 = (int)uVar49;
    local_270 = (uint)bVar4;
    if (iVar47 < iVar26) {
      lVar51 = (long)iVar47;
      do {
        lVar51 = lVar51 + 1;
        uVar22 = *(ushort *)(uVar37 + lVar51 * 2 + -2);
        iVar47 = (int)uVar49;
        if (uVar22 == 0) {
          uVar22 = computeCellSize((CellArray *)local_188,iVar47);
        }
        iVar24 = iVar24 + (uint)uVar22 + 2;
        if (iVar59 < iVar24) goto LAB_00156c09;
        uVar39 = iVar47 + 1;
        uVar49 = (ulong)uVar39;
        *(int *)((long)&local_f8 + uVar43 * 4) = iVar24;
        *(uint *)((long)&local_b8 + uVar43 * 4) = uVar39;
        if (local_270 == 0) {
          iVar47 = 0;
          if (lVar51 < lVar50) {
            uVar22 = *(ushort *)(uVar37 + lVar51 * 2);
            if (uVar22 == 0) {
              uVar22 = computeCellSize((CellArray *)local_188,uVar39);
            }
            goto LAB_00156be4;
          }
        }
        else {
LAB_00156be4:
          iVar47 = uVar22 + 2;
        }
        piVar2 = (int *)((long)&local_f8 + uVar43 * 4 + 4);
        *piVar2 = *piVar2 - iVar47;
      } while (lVar51 != lVar50);
LAB_00156c1c:
      uVar52 = uVar43 + 1 & 0xffffffff;
    }
    else {
LAB_00156c09:
      if (iVar26 <= iVar47) goto LAB_00156c1c;
      if (uVar43 == 0) {
        iVar24 = 0;
      }
      else {
        iVar24 = (&iStack_bc)[uVar43];
      }
      if (iVar47 <= iVar24) {
        uVar53 = 0;
        uVar37 = 0x135bf;
        goto LAB_00156e65;
      }
    }
    uVar43 = uVar43 + 1;
    iVar24 = (int)uVar52;
  } while ((long)uVar43 < (long)iVar24);
  uVar43 = (ulong)(iVar24 - 1);
  do {
    local_200 = (char)uVar53;
    if ((int)uVar43 < 1) {
      bVar5 = *local_58[0]->aData;
      if (iVar24 < 1) {
        uVar48 = 0;
        goto LAB_001572b0;
      }
      uVar49 = 0;
      uVar43 = 0;
      goto LAB_0015710b;
    }
    iVar47 = (&iStack_fc)[uVar43];
    iVar27 = *(int *)((long)&local_f8 + uVar43 * 4);
    iVar62 = (&iStack_bc)[uVar43];
    lVar50 = (long)iVar62 - (ulong)bVar4;
    if (*(short *)(uVar37 + lVar50 * 2) == 0) {
      computeCellSize((CellArray *)local_188,(int)lVar50);
    }
    uVar49 = uVar43 - 1;
    lVar50 = (long)iVar62 + 1;
    do {
      N = iVar62 + -1;
      uVar22 = *(ushort *)(uVar37 + lVar50 * 2 + -4);
      if (uVar22 == 0) {
        uVar22 = computeCellSize((CellArray *)local_188,N);
      }
      uVar39 = (uint)*(ushort *)(uVar37 + lVar50 * 2 + (-2 - (ulong)(local_270 * 2)));
      if (iVar27 == 0) {
        iVar28 = uVar39 + 2;
      }
      else if ((local_200 != '\0') ||
              (iVar28 = uVar39 + iVar27 + 2,
              (int)(((uint)(uVar43 == iVar24 - 1) * 2 + -2 + iVar47) - (uint)uVar22) < iVar28))
      break;
      iVar47 = (iVar47 - (uint)uVar22) + -2;
      *(int *)((long)&local_b8 + uVar49 * 4) = N;
      lVar50 = lVar50 + -1;
      iVar62 = N;
      iVar27 = iVar28;
    } while (1 < lVar50);
    *(int *)((long)&local_f8 + uVar43 * 4) = iVar27;
    *(int *)((long)&local_f8 + uVar49 * 4) = iVar47;
    iVar47 = 0;
    if (uVar43 != 1) {
      iVar47 = *(int *)((long)&local_b8 + (ulong)((int)uVar43 - 2) * 4);
    }
    uVar43 = uVar49;
  } while (iVar47 < iVar62);
  uVar53 = 0;
  uVar37 = 0x135eb;
LAB_00156e65:
  sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar37);
  iVar24 = 0xb;
  goto LAB_00156e73;
LAB_0015710b:
  do {
    local_1c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    uVar53 = (uint)uVar43;
    if (uVar64 < uVar49) {
      PVar61 = 1;
      if (local_200 == '\0') {
        PVar61 = local_1a8;
      }
      iVar24 = allocateBtreePage(pBVar11,(MemPage **)local_1c8,&local_1a8,PVar61,'\0');
      uVar37 = local_1c8._0_8_;
      local_1a4 = iVar24;
      if (iVar24 != 0) goto LAB_00156e73;
      zeroPage((MemPage *)local_1c8._0_8_,(uint)bVar5);
      local_88[uVar49] = (MemPage *)uVar37;
      uVar43 = (ulong)(uVar53 + 1);
      *(int *)((long)&local_d8 + uVar49 * 4) = iVar26;
      if (pBVar11->autoVacuum != '\0') {
        ptrmapPut(pBVar11,*(Pgno *)(uVar37 + 4),'\x05',pMVar45->pgno,&local_1a4);
        goto LAB_0015720d;
      }
    }
    else {
      pMVar46 = local_58[uVar49];
      local_88[uVar49] = pMVar46;
      local_58[uVar49] = (MemPage *)0x0;
      local_1a4 = sqlite3PagerWrite(pMVar46->pDbPage);
      uVar53 = uVar53 + 1;
      uVar43 = (ulong)uVar53;
      if (((uVar48 - iVar38 == uVar49) + 1 != (int)pMVar46->pDbPage->nRef) && (local_1a4 == 0)) {
        iVar24 = 0xb;
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1360c);
        goto LAB_00156e73;
      }
LAB_0015720d:
      uVar53 = (uint)uVar43;
      iVar24 = local_1a4;
      if (local_1a4 != 0) goto LAB_00156e73;
    }
    uVar49 = uVar49 + 1;
  } while (uVar52 != uVar49);
  uVar48 = (uint)uVar43;
  if ((int)uVar48 < 1) {
LAB_001572b0:
    uVar43 = (ulong)uVar48;
    uVar48 = uVar48 - 1;
    bVar65 = false;
    bVar20 = 0;
  }
  else {
    uVar52 = 0;
    do {
      *(Pgno *)((long)&local_118 + uVar52 * 4) = local_88[uVar52]->pgno;
      uVar52 = uVar52 + 1;
    } while (uVar43 != uVar52);
    if (uVar48 == 1) {
      bVar20 = 1;
      uVar43 = 1;
      bVar65 = false;
      uVar48 = 0;
    }
    else {
      uVar48 = uVar48 - 1;
      uVar49 = 1;
      uVar52 = 0;
      do {
        uVar42 = uVar52 & 0xffffffff;
        uVar33 = uVar49;
        do {
          uVar53 = (uint)uVar33;
          if (local_88[(int)(uint)uVar42]->pgno <= local_88[uVar33]->pgno) {
            uVar53 = (uint)uVar42;
          }
          uVar33 = uVar33 + 1;
          uVar42 = (ulong)uVar53;
        } while (uVar43 != uVar33);
        if (uVar52 != uVar53) {
          pMVar46 = local_88[uVar52];
          PVar61 = pMVar46->pgno;
          pMVar44 = local_88[(int)uVar53];
          PVar34 = pMVar44->pgno;
          uVar53 = (uint)sqlite3PendingByte / pBVar11->pageSize;
          pPVar14 = pMVar46->pDbPage;
          uVar21 = pPVar14->flags;
          uVar8 = pMVar44->pDbPage->flags;
          pPVar14->flags = uVar8;
          sqlite3PcacheMove(pPVar14,uVar53 + 1);
          pPVar14 = pMVar44->pDbPage;
          pPVar14->flags = uVar21;
          sqlite3PcacheMove(pPVar14,PVar61);
          pPVar14 = pMVar46->pDbPage;
          pPVar14->flags = uVar8;
          sqlite3PcacheMove(pPVar14,PVar34);
          pMVar46->pgno = PVar34;
          pMVar44->pgno = PVar61;
        }
        uVar52 = uVar52 + 1;
        uVar49 = uVar49 + 1;
      } while (uVar52 != uVar48);
      bVar65 = true;
      bVar20 = 1;
    }
  }
  pMVar46 = local_88[(int)uVar48];
  uVar53 = pMVar46->pgno;
  *(uint *)(puVar12 + uVar55) =
       uVar53 >> 0x18 | (uVar53 & 0xff0000) >> 8 | (uVar53 & 0xff00) << 8 | uVar53 << 0x18;
  uVar53 = (uint)uVar43;
  if (((bVar5 & 8) == 0) && (uVar25 != uVar53)) {
    ppMVar31 = local_58;
    if ((int)uVar25 < (int)uVar53) {
      ppMVar31 = local_88;
    }
    *(undefined4 *)(pMVar46->aData + 8) = *(undefined4 *)(ppMVar31[uVar64]->aData + 8);
  }
  if (0 < iVar26 && pBVar11->autoVacuum != '\0') {
    uVar55 = (ulong)((uint)local_88[0]->nCell + (uint)local_88[0]->nOverflow);
    uVar64 = 0;
    iVar27 = 0;
    iVar47 = 0;
    pMVar46 = local_88[0];
    pMVar44 = local_88[0];
    do {
      if (uVar64 == uVar55) {
        lVar50 = (long)iVar27;
        ppMVar31 = local_58 + lVar50 + 1;
        ppMVar41 = local_88 + lVar50 + 1;
        do {
          lVar50 = lVar50 + 1;
          ppMVar56 = ppMVar31;
          if (lVar50 < (int)uVar53) {
            ppMVar56 = ppMVar41;
          }
          pMVar46 = *ppMVar56;
          uVar55 = (ulong)((int)uVar55 + (uint)(bVar4 == 0) + (uint)pMVar46->nCell +
                          (uint)pMVar46->nOverflow);
          iVar27 = iVar27 + 1;
          ppMVar31 = ppMVar31 + 1;
          ppMVar41 = ppMVar41 + 1;
        } while (uVar64 == uVar55);
      }
      pMVar58 = *(MemPage **)(local_188._16_8_ + uVar64 * 8);
      lVar50 = (long)iVar47;
      if (uVar64 == *(uint *)((long)&local_b8 + lVar50 * 4)) {
        iVar47 = iVar47 + 1;
        pMVar44 = local_88[lVar50 + 1];
        if (bVar4 != 0) goto LAB_001573fa;
      }
      else {
LAB_001573fa:
        if (((((int)uVar53 <= iVar27) ||
             (pMVar44->pgno != *(Pgno *)((long)&local_118 + (long)iVar27 * 4))) ||
            (pMVar58 < (MemPage *)pMVar46->aData)) || ((MemPage *)pMVar46->aDataEnd <= pMVar58)) {
          if (bVar3 == 0) {
            uVar39._0_1_ = pMVar58->isInit;
            uVar39._1_1_ = pMVar58->intKey;
            uVar39._2_1_ = pMVar58->intKeyLeaf;
            uVar39._3_1_ = pMVar58->field_0x3;
            ptrmapPut(pBVar11,uVar39 >> 0x18 | (uVar39 & 0xff0000) >> 8 | (uVar39 & 0xff00) << 8 |
                              uVar39 << 0x18,'\x05',pMVar44->pgno,&local_1a4);
          }
          uVar22 = *(ushort *)(local_188._24_8_ + uVar64 * 2);
          if (uVar22 == 0) {
            uVar22 = computeCellSize((CellArray *)local_188,(int)uVar64);
          }
          if (pMVar44->minLocal < uVar22) {
            ptrmapPutOvflPtr(pMVar44,pMVar46,&pMVar58->isInit,&local_1a4);
          }
          iVar24 = local_1a4;
          if (local_1a4 != 0) goto LAB_00156e73;
          iVar26 = local_188._0_4_;
        }
      }
      uVar64 = uVar64 + 1;
    } while ((long)uVar64 < (long)iVar26);
  }
  uVar18 = local_188._24_8_;
  uVar37 = local_188._16_8_;
  if (bVar65) {
    uVar64 = 0;
    iVar47 = 0;
    do {
      pMVar46 = local_88[uVar64];
      iVar24 = *(int *)((long)&local_b8 + uVar64 * 4);
      lVar50 = (long)iVar24;
      pMVar44 = *(MemPage **)(uVar37 + lVar50 * 8);
      uVar22 = *(ushort *)(uVar18 + lVar50 * 2);
      uVar39 = (int)lVar36 + (uint)uVar22;
      pMVar58 = (MemPage *)((long)iVar47 + (long)pvVar30);
      if (pMVar46->leaf == '\0') {
        puVar12 = pMVar46->aData;
        uVar6 = pMVar44->intKey;
        uVar15 = pMVar44->intKeyLeaf;
        uVar17 = pMVar44->field_0x3;
        puVar12[8] = pMVar44->isInit;
        puVar12[9] = uVar6;
        puVar12[10] = uVar15;
        puVar12[0xb] = uVar17;
      }
      else if (bVar4 == 0) {
        pMVar44 = (MemPage *)((long)&pMVar44[-1].xParseCell + 4);
        if (uVar22 == 4) {
          uVar21 = (*pMVar45->xCellSize)(pMVar45,(u8 *)pMVar44);
          uVar39 = (uint)uVar21;
        }
      }
      else {
        local_1c8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_1c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_1c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        iVar24 = iVar24 + -1;
        (*pMVar46->xParseCell)
                  (pMVar46,&(*(MemPage **)(uVar37 + (lVar50 + -1) * 8))->isInit,
                   (CellInfo *)local_1c8);
        iVar27 = sqlite3PutVarint((uchar *)&pMVar58->pgno,local_1c8._0_8_);
        uVar39 = iVar27 + 4;
        pMVar44 = pMVar58;
        pMVar58 = (MemPage *)0x0;
      }
      lVar50 = 0;
      do {
        lVar51 = lVar50 + 4;
        piVar2 = (int *)((long)&local_138 + lVar50);
        lVar50 = lVar51;
      } while (*piVar2 <= iVar24);
      if ((pMVar44 < *(MemPage **)(local_188 + lVar51 * 2 + 0x18)) &&
         (*(MemPage **)(local_188 + lVar51 * 2 + 0x18) <
          (MemPage *)((long)pMVar44->aiOvfl + (long)(int)uVar39 + -0x1c))) {
        uVar37 = 0x136d5;
        goto LAB_00156e65;
      }
      iVar24 = insertCell(pMVar45,iVar38 + (int)uVar64,&pMVar44->isInit,uVar39,&pMVar58->isInit,
                          pMVar46->pgno);
      if (iVar24 != 0) goto LAB_00156e73;
      iVar47 = iVar47 + uVar39;
      uVar64 = uVar64 + 1;
    } while (uVar64 != uVar48);
  }
  uVar48 = 1 - uVar53;
  if ((int)uVar48 < (int)uVar53) {
    PVar61 = (Pgno)local_b8;
    iVar38 = uVar53 * 2 + -1;
    do {
      uVar39 = -uVar48;
      if (0 < (int)uVar48) {
        uVar39 = uVar48;
      }
      uVar64 = (ulong)uVar39;
      if (local_1a0[uVar64] == '\0') {
        if ((int)uVar48 < 0) {
          if ((&iStack_bc)[(int)uVar39] <= (&iStack_dc)[(int)uVar39]) goto LAB_001576e3;
        }
        else {
          if (uVar48 == 0) {
            iVar47 = 0;
            iVar24 = 0;
            PVar34 = PVar61;
          }
          else {
LAB_001576e3:
            if (uVar57 < uVar39) {
              uVar55 = (ulong)(uVar39 - 1);
              iVar24 = iVar26;
            }
            else {
              uVar55 = (ulong)(int)(uVar39 - 1);
              iVar24 = *(int *)((long)&local_d8 + uVar55 * 4) + (uint)(bVar4 == 0);
            }
            iVar47 = *(int *)((long)&local_b8 + uVar55 * 4) + (uint)(bVar4 == 0);
            PVar34 = *(int *)((long)&local_b8 + uVar64 * 4) - iVar47;
          }
          pMVar46 = local_88[uVar64];
          iVar24 = editPage(pMVar46,iVar24,iVar47,PVar34,(CellArray *)local_188);
          if (iVar24 != 0) goto LAB_00156e73;
          local_1a0[uVar64] = '\x01';
          pMVar46->nFree = iVar59 - *(int *)((long)&local_f8 + uVar64 * 4);
        }
      }
      uVar48 = uVar48 + 1;
      iVar38 = iVar38 + -1;
    } while (iVar38 != 0);
  }
  pMVar46 = local_88[0];
  local_1a4 = 0;
  if (((cVar19 == '\x01') && (pMVar45->nCell == 0)) &&
     ((int)(uint)pMVar45->hdrOffset <= local_88[0]->nFree)) {
    local_1a4 = defragmentPage(local_88[0],-1);
    copyNodeContent(pMVar46,pMVar45,&local_1a4);
    iVar24 = local_1a4;
    if (local_1a4 == 0) {
      iVar24 = freePage2(pMVar46->pBt,pMVar46,pMVar46->pgno);
    }
  }
  else {
    iVar24 = 0;
    if ((bool)(bVar20 & bVar3 == 0 & pBVar11->autoVacuum != '\0')) {
      uVar64 = 0;
      do {
        uVar48 = *(uint *)(local_88[uVar64]->aData + 8);
        ptrmapPut(pBVar11,uVar48 >> 0x18 | (uVar48 & 0xff0000) >> 8 | (uVar48 & 0xff00) << 8 |
                          uVar48 << 0x18,'\x05',local_88[uVar64]->pgno,&local_1a4);
        uVar64 = uVar64 + 1;
        iVar24 = local_1a4;
      } while (uVar43 != uVar64);
    }
  }
  if ((int)uVar53 <= (int)uVar57) {
    lVar36 = 0;
    do {
      if (iVar24 == 0) {
        pMVar45 = local_58[(int)uVar53 + lVar36];
        iVar24 = freePage2(pMVar45->pBt,pMVar45,pMVar45->pgno);
      }
      lVar36 = lVar36 + 1;
    } while ((uVar57 - uVar53) + 1 != (int)lVar36);
  }
LAB_00156e73:
  if ((MemPage **)local_188._16_8_ != (MemPage **)0x0) {
    sqlite3_free((void *)local_188._16_8_);
  }
LAB_00156e85:
  uVar64 = 0;
  do {
    if (local_58[uVar64] != (MemPage *)0x0) {
      sqlite3PagerUnrefNotNull(local_58[uVar64]->pDbPage);
    }
    uVar64 = uVar64 + 1;
  } while (uVar25 != uVar64);
  if (0 < (int)uVar53) {
    uVar64 = 0;
    do {
      if (local_88[uVar64] != (MemPage *)0x0) {
        sqlite3PagerUnrefNotNull(local_88[uVar64]->pDbPage);
      }
      uVar64 = uVar64 + 1;
    } while (uVar53 != uVar64);
  }
LAB_00156ee0:
  if (local_1f8 != (void *)0x0) {
    pcache1Free(local_1f8);
  }
LAB_00156f02:
  local_1f8 = pvVar30;
  pPage->nOverflow = '\0';
  sqlite3PagerUnrefNotNull(pPage->pDbPage);
  cVar19 = pCur->iPage + -1;
  pCur->iPage = cVar19;
  pMVar45 = pCur->apPage[cVar19];
LAB_00156f25:
  pCur->pPage = pMVar45;
  pPage = pMVar45;
  if (iVar24 != 0) {
LAB_00157a6d:
    if (local_1f8 != (void *)0x0) {
      pcache1Free(local_1f8);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
      __stack_chk_fail();
    }
    return iVar24;
  }
  goto LAB_00155ea2;
}

Assistant:

static int balance(BtCursor *pCur){
  int rc = SQLITE_OK;
  u8 aBalanceQuickSpace[13];
  u8 *pFree = 0;

  VVA_ONLY( int balance_quick_called = 0 );
  VVA_ONLY( int balance_deeper_called = 0 );

  do {
    int iPage;
    MemPage *pPage = pCur->pPage;

    if( NEVER(pPage->nFree<0) && btreeComputeFreeSpace(pPage) ) break;
    if( pPage->nOverflow==0 && pPage->nFree*3<=(int)pCur->pBt->usableSize*2 ){
      /* No rebalance required as long as:
      **   (1) There are no overflow cells
      **   (2) The amount of free space on the page is less than 2/3rds of
      **       the total usable space on the page. */
      break;
    }else if( (iPage = pCur->iPage)==0 ){
      if( pPage->nOverflow && (rc = anotherValidCursor(pCur))==SQLITE_OK ){
        /* The root page of the b-tree is overfull. In this case call the
        ** balance_deeper() function to create a new child for the root-page
        ** and copy the current contents of the root-page to it. The
        ** next iteration of the do-loop will balance the child page.
        */
        assert( balance_deeper_called==0 );
        VVA_ONLY( balance_deeper_called++ );
        rc = balance_deeper(pPage, &pCur->apPage[1]);
        if( rc==SQLITE_OK ){
          pCur->iPage = 1;
          pCur->ix = 0;
          pCur->aiIdx[0] = 0;
          pCur->apPage[0] = pPage;
          pCur->pPage = pCur->apPage[1];
          assert( pCur->pPage->nOverflow );
        }
      }else{
        break;
      }
    }else if( sqlite3PagerPageRefcount(pPage->pDbPage)>1 ){
      /* The page being written is not a root page, and there is currently
      ** more than one reference to it. This only happens if the page is one
      ** of its own ancestor pages. Corruption. */
      rc = SQLITE_CORRUPT_PAGE(pPage);
    }else{
      MemPage * const pParent = pCur->apPage[iPage-1];
      int const iIdx = pCur->aiIdx[iPage-1];

      rc = sqlite3PagerWrite(pParent->pDbPage);
      if( rc==SQLITE_OK && pParent->nFree<0 ){
        rc = btreeComputeFreeSpace(pParent);
      }
      if( rc==SQLITE_OK ){
#ifndef SQLITE_OMIT_QUICKBALANCE
        if( pPage->intKeyLeaf
         && pPage->nOverflow==1
         && pPage->aiOvfl[0]==pPage->nCell
         && pParent->pgno!=1
         && pParent->nCell==iIdx
        ){
          /* Call balance_quick() to create a new sibling of pPage on which
          ** to store the overflow cell. balance_quick() inserts a new cell
          ** into pParent, which may cause pParent overflow. If this
          ** happens, the next iteration of the do-loop will balance pParent
          ** use either balance_nonroot() or balance_deeper(). Until this
          ** happens, the overflow cell is stored in the aBalanceQuickSpace[]
          ** buffer.
          **
          ** The purpose of the following assert() is to check that only a
          ** single call to balance_quick() is made for each call to this
          ** function. If this were not verified, a subtle bug involving reuse
          ** of the aBalanceQuickSpace[] might sneak in.
          */
          assert( balance_quick_called==0 );
          VVA_ONLY( balance_quick_called++ );
          rc = balance_quick(pParent, pPage, aBalanceQuickSpace);
        }else
#endif
        {
          /* In this case, call balance_nonroot() to redistribute cells
          ** between pPage and up to 2 of its sibling pages. This involves
          ** modifying the contents of pParent, which may cause pParent to
          ** become overfull or underfull. The next iteration of the do-loop
          ** will balance the parent page to correct this.
          **
          ** If the parent page becomes overfull, the overflow cell or cells
          ** are stored in the pSpace buffer allocated immediately below.
          ** A subsequent iteration of the do-loop will deal with this by
          ** calling balance_nonroot() (balance_deeper() may be called first,
          ** but it doesn't deal with overflow cells - just moves them to a
          ** different page). Once this subsequent call to balance_nonroot()
          ** has completed, it is safe to release the pSpace buffer used by
          ** the previous call, as the overflow cell data will have been
          ** copied either into the body of a database page or into the new
          ** pSpace buffer passed to the latter call to balance_nonroot().
          */
          u8 *pSpace = sqlite3PageMalloc(pCur->pBt->pageSize);
          rc = balance_nonroot(pParent, iIdx, pSpace, iPage==1,
                               pCur->hints&BTREE_BULKLOAD);
          if( pFree ){
            /* If pFree is not NULL, it points to the pSpace buffer used
            ** by a previous call to balance_nonroot(). Its contents are
            ** now stored either on real database pages or within the
            ** new pSpace buffer, so it may be safely freed here. */
            sqlite3PageFree(pFree);
          }

          /* The pSpace buffer will be freed after the next call to
          ** balance_nonroot(), or just before this function returns, whichever
          ** comes first. */
          pFree = pSpace;
        }
      }

      pPage->nOverflow = 0;

      /* The next iteration of the do-loop balances the parent page. */
      releasePage(pPage);
      pCur->iPage--;
      assert( pCur->iPage>=0 );
      pCur->pPage = pCur->apPage[pCur->iPage];
    }
  }while( rc==SQLITE_OK );

  if( pFree ){
    sqlite3PageFree(pFree);
  }
  return rc;
}